

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.cpp
# Opt level: O2

bool MeCab::escape_csv_element(string *w)

{
  long lVar1;
  char cVar2;
  size_t j;
  ulong uVar3;
  allocator local_41;
  string tmp;
  
  lVar1 = std::__cxx11::string::find((char)w,0x2c);
  if ((lVar1 == -1) && (lVar1 = std::__cxx11::string::find((char)w,0x22), lVar1 == -1)) {
    return true;
  }
  std::__cxx11::string::string((string *)&tmp,"\"",&local_41);
  for (uVar3 = 0; uVar3 < w->_M_string_length; uVar3 = uVar3 + 1) {
    cVar2 = (char)&tmp;
    if ((w->_M_dataplus)._M_p[uVar3] == '\"') {
      std::__cxx11::string::push_back(cVar2);
    }
    std::__cxx11::string::push_back(cVar2);
  }
  std::__cxx11::string::push_back((char)&tmp);
  std::__cxx11::string::_M_assign((string *)w);
  std::__cxx11::string::~string((string *)&tmp);
  return true;
}

Assistant:

bool escape_csv_element(std::string *w) {
  if (w->find(',') != std::string::npos ||
      w->find('"') != std::string::npos) {
    std::string tmp = "\"";
    for (size_t j = 0; j < w->size(); j++) {
      if ((*w)[j] == '"') tmp += '"';
      tmp += (*w)[j];
    }
    tmp += '"';
    *w = tmp;
  }
  return true;
}